

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O2

uint * crnlib::crnlib_new_array<unsigned_int>(uint32 num)

{
  void *pvVar1;
  uint *puVar2;
  uint uVar3;
  
  if (num < 0xfffffffd) {
    uVar3 = num + (num == 0);
    pvVar1 = crnlib_malloc((ulong)uVar3 * 4 + 0x10);
    puVar2 = (uint *)((long)pvVar1 + 0x10);
    *(uint *)((long)pvVar1 + 0xc) = uVar3;
    *(uint *)((long)pvVar1 + 8) = ~uVar3;
  }
  else {
    crnlib_mem_error("crnlib_new_array: Array too large!");
    puVar2 = (uint *)0x0;
  }
  return puVar2;
}

Assistant:

inline T* crnlib_new_array(uint32 num)
    {
        if (!num)
        {
            num = 1;
        }

        uint64 total = CRNLIB_MIN_ALLOC_ALIGNMENT + sizeof(T) * num;
        if (total > CRNLIB_MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnlib_mem_error("crnlib_new_array: Array too large!");
            return nullptr;
        }
        uint8* q = static_cast<uint8*>(crnlib_malloc(static_cast<size_t>(total)));

        T* p = reinterpret_cast<T*>(q + CRNLIB_MIN_ALLOC_ALIGNMENT);

        reinterpret_cast<uint32*>(p)[-1] = num;
        reinterpret_cast<uint32*>(p)[-2] = ~num;

        if (!CRNLIB_IS_SCALAR_TYPE(T))
        {
            helpers::construct_array(p, num);
        }
        return p;
    }